

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_logger.hpp
# Opt level: O2

void duckdb::HTTPLogger::
     TemplatedWriteRequests<std::ofstream,duckdb_httplib::Request,duckdb_httplib::Response>
               (basic_ofstream<char,_std::char_traits<char>_> *out,Request *req,Response *res)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  
  ::std::operator<<((ostream *)out,"HTTP Request:\n");
  poVar1 = ::std::operator<<((ostream *)out,anon_var_dwarf_3b2ab35 + 7);
  poVar1 = ::std::operator<<(poVar1,(string *)req);
  poVar1 = ::std::operator<<(poVar1," ");
  poVar1 = ::std::operator<<(poVar1,(string *)&req->path);
  ::std::operator<<(poVar1,anon_var_dwarf_3b2a754 + 8);
  for (p_Var2 = (req->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(req->headers)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)::std::_Rb_tree_increment(p_Var2)) {
    poVar1 = ::std::operator<<((ostream *)out,anon_var_dwarf_3b2ab35 + 7);
    poVar1 = ::std::operator<<(poVar1,(string *)(p_Var2 + 1));
    poVar1 = ::std::operator<<(poVar1,": ");
    poVar1 = ::std::operator<<(poVar1,(string *)(p_Var2 + 2));
    ::std::operator<<(poVar1,anon_var_dwarf_3b2a754 + 8);
  }
  ::std::operator<<((ostream *)out,"\nHTTP Response:\n");
  poVar1 = ::std::operator<<((ostream *)out,anon_var_dwarf_3b2ab35 + 7);
  poVar1 = (ostream *)::std::ostream::operator<<(poVar1,res->status);
  poVar1 = ::std::operator<<(poVar1," ");
  poVar1 = ::std::operator<<(poVar1,(string *)&res->reason);
  poVar1 = ::std::operator<<(poVar1," ");
  poVar1 = ::std::operator<<(poVar1,(string *)&req->version);
  ::std::operator<<(poVar1,anon_var_dwarf_3b2a754 + 8);
  for (p_Var2 = (res->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(res->headers)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)::std::_Rb_tree_increment(p_Var2)) {
    poVar1 = ::std::operator<<((ostream *)out,anon_var_dwarf_3b2ab35 + 7);
    poVar1 = ::std::operator<<(poVar1,(string *)(p_Var2 + 1));
    poVar1 = ::std::operator<<(poVar1,": ");
    poVar1 = ::std::operator<<(poVar1,(string *)(p_Var2 + 2));
    ::std::operator<<(poVar1,anon_var_dwarf_3b2a754 + 8);
  }
  ::std::operator<<((ostream *)out,anon_var_dwarf_3b2a754 + 8);
  return;
}

Assistant:

static inline void TemplatedWriteRequests(STREAM &out, const REQUEST &req, const RESPONSE &res) {
		out << "HTTP Request:\n";
		out << "\t" << req.method << " " << req.path << "\n";
		for (auto &entry : req.headers) {
			out << "\t" << entry.first << ": " << entry.second << "\n";
		}
		out << "\nHTTP Response:\n";
		out << "\t" << res.status << " " << res.reason << " " << req.version << "\n";
		for (auto &entry : res.headers) {
			out << "\t" << entry.first << ": " << entry.second << "\n";
		}
		out << "\n";
	}